

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::AdvancedSwitchProgramsCS::GenSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int binding)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198;
  int local_1c;
  void *pvStack_18;
  int binding_local;
  AdvancedSwitchProgramsCS *this_local;
  
  local_1c = binding;
  pvStack_18 = this;
  this_local = (AdvancedSwitchProgramsCS *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(&local_198,"\nlayout(local_size_x = 1) in;\nlayout(binding = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::operator<<(poVar1,
                  ", std430) buffer Input {\n  uint cookie[4];\n} g_in;\nlayout(binding = 0, std430) buffer Output {\n  uvec4 digest;\n} ;\nvoid main() {\n  switch (g_in.cookie[0]+g_in.cookie[1]+g_in.cookie[2]+g_in.cookie[3]) {\n    case 0x000000ffu: digest.x = 0xff000000u; break;\n    case 0x0000ff00u: digest.y = 0x00ff0000u; break;\n    case 0x00ff0000u: digest.z = 0x0000ff00u; break;\n    case 0xff000000u: digest.w = 0x000000ffu; break;\n  }\n}"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GenSource(int binding)
	{
		std::stringstream ss;
		ss << NL "layout(local_size_x = 1) in;" NL "layout(binding = " << binding
		   << ", std430) buffer Input {" NL "  uint cookie[4];" NL "} g_in;" NL
			  "layout(binding = 0, std430) buffer Output {" NL "  uvec4 digest;" NL "} ;" NL "void main() {" NL
			  "  switch (g_in.cookie[0]+g_in.cookie[1]+g_in.cookie[2]+g_in.cookie[3]) {" NL
			  "    case 0x000000ffu: digest.x = 0xff000000u; break;" NL
			  "    case 0x0000ff00u: digest.y = 0x00ff0000u; break;" NL
			  "    case 0x00ff0000u: digest.z = 0x0000ff00u; break;" NL
			  "    case 0xff000000u: digest.w = 0x000000ffu; break;" NL "  }" NL "}";
		return ss.str();
	}